

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int s2pred::ExactCompareDistances(Vector3_xf *x,Vector3_xf *a,Vector3_xf *b)

{
  int iVar1;
  int iVar2;
  ExactFloat local_d0;
  ExactFloat local_c0;
  ExactFloat local_b0;
  ExactFloat local_a0;
  ExactFloat local_90;
  ExactFloat local_80;
  undefined1 local_70 [8];
  ExactFloat cmp;
  int b_sign;
  int a_sign;
  undefined1 local_48 [8];
  ExactFloat cos_bx;
  ExactFloat cos_ax;
  Vector3_xf *b_local;
  Vector3_xf *a_local;
  Vector3_xf *x_local;
  
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)&cos_bx.bn_,x);
  util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::DotProd
            ((BasicVector<Vector3,_ExactFloat,_3UL> *)local_48,x);
  iVar1 = ExactFloat::sgn((ExactFloat *)&cos_bx.bn_);
  cmp.bn_.bn_._4_4_ = ExactFloat::sgn((ExactFloat *)local_48);
  if (iVar1 == cmp.bn_.bn_._4_4_) {
    ::operator*(&local_90,(ExactFloat *)local_48);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_a0);
    ::operator*(&local_80,&local_90);
    ::operator*(&local_c0,(ExactFloat *)&cos_bx.bn_);
    util::math::internal_vector::BasicVector<Vector3,_ExactFloat,_3UL>::Norm2
              ((BasicVector<Vector3,_ExactFloat,_3UL> *)&local_d0);
    ::operator*(&local_b0,&local_c0);
    ::operator-((ExactFloat *)local_70,&local_80);
    ExactFloat::~ExactFloat(&local_b0);
    ExactFloat::~ExactFloat(&local_d0);
    ExactFloat::~ExactFloat(&local_c0);
    ExactFloat::~ExactFloat(&local_80);
    ExactFloat::~ExactFloat(&local_a0);
    ExactFloat::~ExactFloat(&local_90);
    iVar2 = ExactFloat::sgn((ExactFloat *)local_70);
    x_local._4_4_ = iVar1 * iVar2;
    cmp.bn_.bn_._0_4_ = 1;
    ExactFloat::~ExactFloat((ExactFloat *)local_70);
  }
  else {
    x_local._4_4_ = 1;
    if (cmp.bn_.bn_._4_4_ < iVar1) {
      x_local._4_4_ = -1;
    }
    cmp.bn_.bn_._0_4_ = 1;
  }
  ExactFloat::~ExactFloat((ExactFloat *)local_48);
  ExactFloat::~ExactFloat((ExactFloat *)&cos_bx.bn_);
  return x_local._4_4_;
}

Assistant:

int ExactCompareDistances(const Vector3_xf& x,
                          const Vector3_xf& a, const Vector3_xf& b) {
  // This code produces the same result as though all points were reprojected
  // to lie exactly on the surface of the unit sphere.  It is based on testing
  // whether x.DotProd(a.Normalize()) < x.DotProd(b.Normalize()), reformulated
  // so that it can be evaluated using exact arithmetic.
  ExactFloat cos_ax = x.DotProd(a);
  ExactFloat cos_bx = x.DotProd(b);
  // If the two values have different signs, we need to handle that case now
  // before squaring them below.
  int a_sign = cos_ax.sgn(), b_sign = cos_bx.sgn();
  if (a_sign != b_sign) {
    return (a_sign > b_sign) ? -1 : 1;  // If cos(AX) > cos(BX), then AX < BX.
  }
  ExactFloat cmp = cos_bx * cos_bx * a.Norm2() - cos_ax * cos_ax * b.Norm2();
  return a_sign * cmp.sgn();
}